

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_queue.c
# Opt level: O3

_Bool find_item_by_message_id(LIST_ITEM_HANDLE list_item,void *match_context)

{
  int *piVar1;
  LOGGER_LOG p_Var2;
  _Bool _Var3;
  
  piVar1 = (int *)singlylinkedlist_item_get_value(list_item);
  if (piVar1 == (int *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      _Var3 = false;
    }
    else {
      _Var3 = false;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/message_queue.c"
                ,"find_item_by_message_id",0x3e,1,"Failed finding item: current_item is NULL");
    }
  }
  else {
    _Var3 = *piVar1 == *match_context;
  }
  return _Var3;
}

Assistant:

static bool find_item_by_message_id(LIST_ITEM_HANDLE list_item, const void* match_context)
{
    bool result;
    MESSAGE_QUEUE_ITEM* current_item = (MESSAGE_QUEUE_ITEM*)singlylinkedlist_item_get_value(list_item);
    uint32_t message_id = *(uint32_t*)match_context;

    if (current_item == NULL)
    {
        LogError("Failed finding item: current_item is NULL");
        result = false;
    }
    else
    {
        result = (current_item->id == message_id);
    }
    return result;
}